

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.h
# Opt level: O0

double * __thiscall vec<3UL,_double>::operator[](vec<3UL,_double> *this,size_t i)

{
  vec<3UL,_double> *local_38;
  vec<3UL,_double> *local_30;
  size_t i_local;
  vec<3UL,_double> *this_local;
  
  if (2 < i) {
    __assert_fail("i >= 0 && i < 3",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cdgiessen[P]TinyRenderer/ext/geometry.h"
                  ,0x8c,"T &vec<3>::operator[](const size_t) [n = 3, T = double]");
  }
  local_30 = this;
  if (i != 0) {
    if (i == 1) {
      local_38 = (vec<3UL,_double> *)&this->y;
    }
    else {
      local_38 = (vec<3UL,_double> *)&this->z;
    }
    local_30 = local_38;
  }
  return &local_30->x;
}

Assistant:

T& operator[](const size_t i)
    {
        assert(i >= 0 && i < 3);
        return i == 0 ? x : (1 == i ? y : z);
    }